

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

int Ivy_ManSetLevels(Ivy_Man_t *p,int fHaig)

{
  byte *pbVar1;
  uint *puVar2;
  void *pvVar3;
  Ivy_Obj_t *pObj;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  long lVar7;
  
  if ((fHaig != 0) && (pVVar5 = p->vObjs, 0 < pVVar5->nSize)) {
    lVar7 = 0;
    do {
      puVar2 = (uint *)pVVar5->pArray[lVar7];
      if ((puVar2 != (uint *)0x0) &&
         ((((puVar2[2] & 0xf) == 4 || ((puVar2[2] & 0xf) == 1)) && (*(long *)(puVar2 + 0x12) != 0)))
         ) {
        printf("CI %d has a choice, which will not be visualized.\n",(ulong)*puVar2);
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      if (pVVar5->pArray[lVar7] != (void *)0x0) {
        puVar2 = (uint *)((long)pVVar5->pArray[lVar7] + 8);
        *puVar2 = *puVar2 & 0x7ff;
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (pVVar5->nSize < 1) {
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar7];
      if ((pvVar3 != (void *)0x0) &&
         ((uVar4 = *(uint *)((long)pvVar3 + 8) & 0xf, uVar4 == 4 || (uVar4 == 2)))) {
        Ivy_ManSetLevels_rec
                  ((Ivy_Obj_t *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe),fHaig);
        uVar4 = *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 8) >> 0xb;
        if (uVar6 <= uVar4) {
          uVar6 = uVar4;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pObj = (Ivy_Obj_t *)pVVar5->pArray[lVar7];
      if (((pObj != (Ivy_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x8 & 0xf) - 5 < 3)) &&
         (pObj->nRefs == 0)) {
        Ivy_ManSetLevels_rec(pObj,fHaig);
        uVar4 = *(uint *)&pObj->field_0x8 >> 0xb;
        if (uVar6 <= uVar4) {
          uVar6 = uVar4;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      if (pVVar5->pArray[lVar7] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar5->pArray[lVar7] + 8);
        *pbVar1 = *pbVar1 & 0xef;
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
  }
  return uVar6;
}

Assistant:

int Ivy_ManSetLevels( Ivy_Man_t * p, int fHaig )
{
    Ivy_Obj_t * pObj;
    int i, LevelMax;
    // check if CIs have choices
    if ( fHaig )
    {
        Ivy_ManForEachCi( p, pObj, i )
            if ( pObj->pEquiv )
                printf( "CI %d has a choice, which will not be visualized.\n", pObj->Id );
    }
    // clean the levels
    Ivy_ManForEachObj( p, pObj, i )
        pObj->Level = 0;
    // compute the levels
    LevelMax = 0;
    Ivy_ManForEachCo( p, pObj, i )
    {
        Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
        LevelMax = IVY_MAX( LevelMax, (int)Ivy_ObjFanin0(pObj)->Level );
    }
    // compute levels of nodes without fanout
    Ivy_ManForEachObj( p, pObj, i )
        if ( (Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)) && Ivy_ObjRefs(pObj) == 0 )
        {
            Ivy_ManSetLevels_rec( pObj, fHaig );
            LevelMax = IVY_MAX( LevelMax, (int)pObj->Level );
        }
    // clean the marks
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    return LevelMax;
}